

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::writeZone
          (VTimeZone *this,VTZWriter *w,BasicTimeZone *basictz,UVector *customProps,
          UErrorCode *status)

{
  UErrorCode UVar1;
  ulong uVar2;
  int8_t iVar3;
  UBool UVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  TimeZoneRule *pTVar13;
  AnnualTimeZoneRule *pAVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DateTimeRule *pDVar15;
  UVector *__n;
  void *__buf;
  void *__buf_00;
  bool bVar16;
  int32_t i;
  int iVar17;
  int iVar18;
  UDate UVar19;
  int local_250;
  int local_24c;
  VTimeZone *local_248;
  int local_238;
  int local_234;
  UDate local_230;
  AnnualTimeZoneRule *local_228;
  int32_t month;
  int32_t year;
  int local_210;
  int local_20c;
  int32_t mid;
  int32_t dow;
  UDate local_200;
  UDate local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  UDate local_1b8;
  UDate local_1b0;
  ulong local_1a8;
  UDate local_1a0;
  int32_t local_194;
  int local_190;
  int32_t local_18c;
  BasicTimeZone *local_188;
  int32_t dst;
  int32_t raw;
  int32_t dom;
  ulong local_170;
  ulong local_168;
  UObject local_160;
  int32_t doy;
  UnicodeString stdName;
  UnicodeString dstName;
  UnicodeString name;
  UnicodeString tzid;
  TimeZoneTransition tzt;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  __n = customProps;
  local_188 = basictz;
  writeHeaders(this,w,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (customProps != (UVector *)0x0) {
    for (iVar17 = 0; iVar17 < customProps->count; iVar17 = iVar17 + 1) {
      pvVar12 = UVector::elementAt(customProps,iVar17);
      VTZWriter::write(w,(int)pvVar12,__buf,(size_t)__n);
      VTZWriter::write(w,0x2fefae,__buf_00,(size_t)__n);
    }
  }
  dstName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  dstName.fUnion.fStackFields.fLengthAndFlags = 2;
  stdName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  stdName.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneTransition::TimeZoneTransition(&tzt);
  local_160._vptr_UObject = (_func_int **)&PTR__UnicodeString_003d8fe8;
  name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  name.fUnion.fStackFields.fLengthAndFlags = 2;
  local_190 = 0x7fffffff;
  local_230 = -1.84303902528e+17;
  bVar16 = true;
  local_200 = 0.0;
  local_1e8 = 0;
  local_1b0 = 0.0;
  local_1f8 = 0.0;
  local_1b8 = 0.0;
  local_194 = 0;
  local_1a8 = 0;
  local_228 = (AnnualTimeZoneRule *)0x0;
  local_24c = 0;
  local_20c = 0;
  local_234 = 0;
  local_168 = 0;
  local_1c0 = 0;
  local_1c8 = 0;
  local_1d0 = 0;
  local_18c = 0;
  local_1f0 = 0;
  local_248 = (VTimeZone *)0x0;
  local_1e0 = 0;
  local_1d8 = 0;
  local_170 = 0;
  local_238 = 0;
  local_210 = 0;
  local_250 = 0;
  do {
    while( true ) {
      iVar17 = (*(local_188->super_TimeZone).super_UObject._vptr_UObject[0xe])
                         (local_230,local_188,0,&tzt);
      if ((char)iVar17 == '\0') {
        if (bVar16) {
          (*(local_188->super_TimeZone).super_UObject._vptr_UObject[6])
                    (0,local_188,0,&raw,&dst,status);
          if (U_ZERO_ERROR < *status) goto LAB_00212bef;
          iVar17 = raw + dst;
          tzid.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_160._vptr_UObject;
          tzid.fUnion.fStackFields.fLengthAndFlags = 2;
          UnicodeString::operator=(&tzid,&(local_188->super_TimeZone).fID);
          getDefaultTZName(&tzid,dst != 0,&name);
          writeZonePropsByTime(this,w,dst != 0,&name,iVar17,iVar17,0.0 - (double)iVar17,'\0',status)
          ;
          UVar1 = *status;
          UnicodeString::~UnicodeString(&tzid);
          if (U_ZERO_ERROR < UVar1) goto LAB_00212bef;
          goto LAB_00212be2;
        }
        goto LAB_002127e7;
      }
      local_230 = TimeZoneTransition::getTime(&tzt);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      TimeZoneRule::getName(pTVar13,&name);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      iVar5 = TimeZoneRule::getDSTSavings(pTVar13);
      pTVar13 = TimeZoneTransition::getFrom(&tzt);
      iVar6 = TimeZoneRule::getRawOffset(pTVar13);
      pTVar13 = TimeZoneTransition::getFrom(&tzt);
      iVar7 = TimeZoneRule::getDSTSavings(pTVar13);
      pTVar13 = TimeZoneTransition::getFrom(&tzt);
      iVar8 = TimeZoneRule::getDSTSavings(pTVar13);
      local_1a0 = (UDate)CONCAT44(local_1a0._4_4_,iVar8);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      iVar8 = TimeZoneRule::getRawOffset(pTVar13);
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      iVar9 = TimeZoneRule::getDSTSavings(pTVar13);
      UVar19 = TimeZoneTransition::getTime(&tzt);
      iVar17 = iVar7 + iVar6;
      Grego::timeToFields(UVar19 + (double)iVar17,&year,&month,&dom,&dow,&doy,&mid);
      uVar10 = Grego::dayOfWeekInMonth(year,month,dom);
      uVar2 = local_1a8;
      iVar18 = iVar9 + iVar8;
      if (iVar5 == 0) break;
      if (local_228 == (AnnualTimeZoneRule *)0x0) {
        pTVar13 = TimeZoneTransition::getTo(&tzt);
        if (pTVar13 == (TimeZoneRule *)0x0) {
LAB_0021251d:
          local_228 = (AnnualTimeZoneRule *)0x0;
        }
        else {
          pAVar14 = (AnnualTimeZoneRule *)
                    __dynamic_cast(pTVar13,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
          local_228 = (AnnualTimeZoneRule *)0x0;
          if (pAVar14 != (AnnualTimeZoneRule *)0x0) {
            iVar5 = AnnualTimeZoneRule::getEndYear(pAVar14);
            if (iVar5 != local_190) goto LAB_0021251d;
            pTVar13 = TimeZoneTransition::getTo(&tzt);
            iVar11 = (*(pTVar13->super_UObject)._vptr_UObject[3])(pTVar13);
            local_228 = (AnnualTimeZoneRule *)CONCAT44(extraout_var_00,iVar11);
          }
        }
      }
      iVar11 = (int)uVar2;
      if (iVar11 < 1) {
LAB_00212640:
        UnicodeString::operator=(&dstName,&name);
        local_170 = (ulong)(uint)year;
        local_1d8 = (ulong)(uint)month;
        local_1e0 = (ulong)(uint)dow;
        local_194 = mid;
        local_1e8 = (ulong)uVar10;
        local_1a8 = 1;
        local_210 = local_1a0._0_4_;
        local_250 = iVar17;
        local_238 = iVar18;
        local_200 = local_230;
      }
      else {
        if ((((year != (int)local_170 + iVar11) ||
             (iVar3 = UnicodeString::compare(&name,&dstName), iVar3 != '\0')) ||
            (local_250 != iVar17)) ||
           (((local_238 != iVar18 || ((int)local_1d8 != month)) ||
            (((int)local_1e0 != dow || (((uint)local_1e8 != uVar10 || (local_194 != mid)))))))) {
          if (iVar11 == 1) {
            writeZonePropsByTime(this,w,'\x01',&dstName,local_250,local_238,local_200,'\x01',status)
            ;
          }
          else {
            writeZonePropsByDOW(this,w,'\x01',&dstName,local_250,local_238,(int32_t)local_1d8,
                                (int32_t)local_1e8,(int32_t)local_1e0,local_200,local_1b0,status);
          }
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00212640;
          goto LAB_00212bef;
        }
        local_1a8 = (ulong)(iVar11 + 1);
      }
      bVar16 = false;
      local_1b0 = local_230;
      if ((local_248 != (VTimeZone *)0x0) && (local_228 != (AnnualTimeZoneRule *)0x0))
      goto LAB_0021282c;
    }
    if (local_248 == (VTimeZone *)0x0) {
      pTVar13 = TimeZoneTransition::getTo(&tzt);
      if (pTVar13 == (TimeZoneRule *)0x0) {
LAB_002122d8:
        local_248 = (VTimeZone *)0x0;
      }
      else {
        pAVar14 = (AnnualTimeZoneRule *)
                  __dynamic_cast(pTVar13,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
        local_248 = (VTimeZone *)0x0;
        if (pAVar14 != (AnnualTimeZoneRule *)0x0) {
          iVar5 = AnnualTimeZoneRule::getEndYear(pAVar14);
          if (iVar5 != local_190) goto LAB_002122d8;
          pTVar13 = TimeZoneTransition::getTo(&tzt);
          iVar11 = (*(pTVar13->super_UObject)._vptr_UObject[3])(pTVar13);
          local_248 = (VTimeZone *)CONCAT44(extraout_var,iVar11);
        }
      }
    }
    if ((int)local_1f0 < 1) {
LAB_00212404:
      UnicodeString::operator=(&stdName,&name);
      local_168 = (ulong)(uint)year;
      local_1c0 = (ulong)(uint)month;
      local_1c8 = (ulong)(uint)dow;
      local_18c = mid;
      local_20c = local_1a0._0_4_;
      local_1d0 = (ulong)uVar10;
      local_1f0 = 1;
      local_24c = iVar17;
      local_234 = iVar18;
      local_1f8 = local_230;
    }
    else {
      if (((((year != (int)local_1f0 + (int)local_168) ||
            (iVar3 = UnicodeString::compare(&name,&stdName), iVar3 != '\0')) ||
           (local_24c != iVar17)) || ((local_234 != iVar18 || ((int)local_1c0 != month)))) ||
         (((int)local_1c8 != dow || (((uint)local_1d0 != uVar10 || (local_18c != mid)))))) {
        if ((int)local_1f0 == 1) {
          writeZonePropsByTime(this,w,'\0',&stdName,local_24c,local_234,local_1f8,'\x01',status);
        }
        else {
          writeZonePropsByDOW(this,w,'\0',&stdName,local_24c,local_234,(int32_t)local_1c0,
                              (int32_t)local_1d0,(int32_t)local_1c8,local_1f8,local_1b8,status);
        }
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00212404;
        goto LAB_00212bef;
      }
      local_1f0 = (ulong)((int)local_1f0 + 1);
    }
    bVar16 = false;
    local_1b8 = local_230;
  } while ((local_248 == (VTimeZone *)0x0) || (local_228 == (AnnualTimeZoneRule *)0x0));
LAB_002127e7:
  local_230 = local_1b8;
  if ((int)local_1a8 < 1) {
LAB_002129a7:
    if ((int)local_1f0 < 1) {
LAB_00212be2:
      writeFooter(local_248,w,status);
      goto LAB_00212bef;
    }
    if (local_248 == (VTimeZone *)0x0) {
      if ((int)local_1f0 == 1) {
        writeZonePropsByTime(this,w,'\0',&stdName,local_24c,local_234,local_1f8,'\x01',status);
      }
      else {
        writeZonePropsByDOW(this,w,'\0',&stdName,local_24c,local_234,(int32_t)local_1c0,
                            (int32_t)local_1d0,(int32_t)local_1c8,local_1f8,local_230,status);
      }
      if (U_ZERO_ERROR < *status) goto LAB_00212bff;
      local_248 = (VTimeZone *)0x0;
      goto LAB_00212be2;
    }
    if ((int)local_1f0 == 1) {
      writeFinalRule(this,w,'\0',(AnnualTimeZoneRule *)local_248,local_24c - local_20c,local_20c,
                     local_1f8,status);
LAB_00212abd:
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00212be2;
    }
    else {
      pDVar15 = AnnualTimeZoneRule::getRule((AnnualTimeZoneRule *)local_248);
      UVar4 = isEquivalentDateRule((int32_t)local_1c0,(int32_t)local_1d0,(int32_t)local_1c8,pDVar15)
      ;
      if (UVar4 != '\0') {
        writeZonePropsByDOW(this,w,'\0',&stdName,local_24c,local_234,(int32_t)local_1c0,
                            (int32_t)local_1d0,(int32_t)local_1c8,local_1f8,1.838821689216e+17,
                            status);
        goto LAB_00212abd;
      }
      writeZonePropsByDOW(this,w,'\0',&stdName,local_24c,local_234,(int32_t)local_1c0,
                          (int32_t)local_1d0,(int32_t)local_1c8,local_1f8,local_230,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_24c = local_24c - local_20c;
        iVar17 = (*(local_248->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                           (local_230);
        if ((char)iVar17 != '\0') {
          writeFinalRule(this,w,'\0',(AnnualTimeZoneRule *)local_248,local_24c,local_20c,
                         (UDate)tzid.super_Replaceable.super_UObject._vptr_UObject,status);
        }
        goto LAB_00212abd;
      }
    }
  }
  else {
    if (local_228 == (AnnualTimeZoneRule *)0x0) {
      if ((int)local_1a8 == 1) {
        writeZonePropsByTime(this,w,'\x01',&dstName,local_250,local_238,local_200,'\x01',status);
      }
      else {
        writeZonePropsByDOW(this,w,'\x01',&dstName,local_250,local_238,(int32_t)local_1d8,
                            (int32_t)local_1e8,(int32_t)local_1e0,local_200,local_1b0,status);
      }
      local_228 = (AnnualTimeZoneRule *)0x0;
LAB_0021299e:
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002129a7;
    }
    else {
LAB_0021282c:
      local_1a0 = local_1b0;
      local_230 = local_1b8;
      if ((int)local_1a8 == 1) {
        writeFinalRule(this,w,'\x01',local_228,local_250 - local_210,local_210,local_200,status);
        goto LAB_0021299e;
      }
      pDVar15 = AnnualTimeZoneRule::getRule(local_228);
      UVar4 = isEquivalentDateRule((int32_t)local_1d8,(int32_t)local_1e8,(int32_t)local_1e0,pDVar15)
      ;
      if (UVar4 != '\0') {
        writeZonePropsByDOW(this,w,'\x01',&dstName,local_250,local_238,(int32_t)local_1d8,
                            (int32_t)local_1e8,(int32_t)local_1e0,local_200,1.838821689216e+17,
                            status);
        goto LAB_0021299e;
      }
      writeZonePropsByDOW(this,w,'\x01',&dstName,local_250,local_238,(int32_t)local_1d8,
                          (int32_t)local_1e8,(int32_t)local_1e0,local_200,local_1a0,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_250 = local_250 - local_210;
        iVar17 = (*(local_228->super_TimeZoneRule).super_UObject._vptr_UObject[9])(local_1a0);
        if ((char)iVar17 != '\0') {
          writeFinalRule(this,w,'\x01',local_228,local_250,local_210,
                         (UDate)tzid.super_Replaceable.super_UObject._vptr_UObject,status);
        }
        goto LAB_0021299e;
      }
    }
LAB_00212bef:
    if (local_248 == (VTimeZone *)0x0) goto LAB_00212bff;
  }
  (*(local_248->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
LAB_00212bff:
  if (local_228 != (AnnualTimeZoneRule *)0x0) {
    (*(local_228->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  UnicodeString::~UnicodeString(&name);
  TimeZoneTransition::~TimeZoneTransition(&tzt);
  UnicodeString::~UnicodeString(&stdName);
  UnicodeString::~UnicodeString(&dstName);
  return;
}

Assistant:

void
VTimeZone::writeZone(VTZWriter& w, BasicTimeZone& basictz,
                     UVector* customProps, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writeHeaders(w, status);
    if (U_FAILURE(status)) {
        return;
    }

    if (customProps != NULL) {
        for (int32_t i = 0; i < customProps->size(); i++) {
            UnicodeString *custprop = (UnicodeString*)customProps->elementAt(i);
            w.write(*custprop);
            w.write(ICAL_NEWLINE);
        }
    }

    UDate t = MIN_MILLIS;
    UnicodeString dstName;
    int32_t dstFromOffset = 0;
    int32_t dstFromDSTSavings = 0;
    int32_t dstToOffset = 0;
    int32_t dstStartYear = 0;
    int32_t dstMonth = 0;
    int32_t dstDayOfWeek = 0;
    int32_t dstWeekInMonth = 0;
    int32_t dstMillisInDay = 0;
    UDate dstStartTime = 0.0;
    UDate dstUntilTime = 0.0;
    int32_t dstCount = 0;
    AnnualTimeZoneRule *finalDstRule = NULL;

    UnicodeString stdName;
    int32_t stdFromOffset = 0;
    int32_t stdFromDSTSavings = 0;
    int32_t stdToOffset = 0;
    int32_t stdStartYear = 0;
    int32_t stdMonth = 0;
    int32_t stdDayOfWeek = 0;
    int32_t stdWeekInMonth = 0;
    int32_t stdMillisInDay = 0;
    UDate stdStartTime = 0.0;
    UDate stdUntilTime = 0.0;
    int32_t stdCount = 0;
    AnnualTimeZoneRule *finalStdRule = NULL;

    int32_t year, month, dom, dow, doy, mid;
    UBool hasTransitions = FALSE;
    TimeZoneTransition tzt;
    UBool tztAvail;
    UnicodeString name;
    UBool isDst;

    // Going through all transitions
    while (TRUE) {
        tztAvail = basictz.getNextTransition(t, FALSE, tzt);
        if (!tztAvail) {
            break;
        }
        hasTransitions = TRUE;
        t = tzt.getTime();
        tzt.getTo()->getName(name);
        isDst = (tzt.getTo()->getDSTSavings() != 0);
        int32_t fromOffset = tzt.getFrom()->getRawOffset() + tzt.getFrom()->getDSTSavings();
        int32_t fromDSTSavings = tzt.getFrom()->getDSTSavings();
        int32_t toOffset = tzt.getTo()->getRawOffset() + tzt.getTo()->getDSTSavings();
        Grego::timeToFields(tzt.getTime() + fromOffset, year, month, dom, dow, doy, mid);
        int32_t weekInMonth = Grego::dayOfWeekInMonth(year, month, dom);
        UBool sameRule = FALSE;
        const AnnualTimeZoneRule *atzrule;
        if (isDst) {
            if (finalDstRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalDstRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (dstCount > 0) {
                if (year == dstStartYear + dstCount
                        && name.compare(dstName) == 0
                        && dstFromOffset == fromOffset
                        && dstToOffset == toOffset
                        && dstMonth == month
                        && dstDayOfWeek == dow
                        && dstWeekInMonth == weekInMonth
                        && dstMillisInDay == mid) {
                    // Update until time
                    dstUntilTime = t;
                    dstCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (dstCount == 1) {
                        writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            } 
            if (!sameRule) {
                // Reset this DST information
                dstName = name;
                dstFromOffset = fromOffset;
                dstFromDSTSavings = fromDSTSavings;
                dstToOffset = toOffset;
                dstStartYear = year;
                dstMonth = month;
                dstDayOfWeek = dow;
                dstWeekInMonth = weekInMonth;
                dstMillisInDay = mid;
                dstStartTime = dstUntilTime = t;
                dstCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        } else {
            if (finalStdRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalStdRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (stdCount > 0) {
                if (year == stdStartYear + stdCount
                        && name.compare(stdName) == 0
                        && stdFromOffset == fromOffset
                        && stdToOffset == toOffset
                        && stdMonth == month
                        && stdDayOfWeek == dow
                        && stdWeekInMonth == weekInMonth
                        && stdMillisInDay == mid) {
                    // Update until time
                    stdUntilTime = t;
                    stdCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (stdCount == 1) {
                        writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            }
            if (!sameRule) {
                // Reset this STD information
                stdName = name;
                stdFromOffset = fromOffset;
                stdFromDSTSavings = fromDSTSavings;
                stdToOffset = toOffset;
                stdStartYear = year;
                stdMonth = month;
                stdDayOfWeek = dow;
                stdWeekInMonth = weekInMonth;
                stdMillisInDay = mid;
                stdStartTime = stdUntilTime = t;
                stdCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        }
    }
    if (!hasTransitions) {
        // No transition - put a single non transition RDATE
        int32_t raw, dst, offset;
        basictz.getOffset(0.0/*any time*/, FALSE, raw, dst, status);
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
        offset = raw + dst;
        isDst = (dst != 0);
        UnicodeString tzid;
        basictz.getID(tzid);
        getDefaultTZName(tzid, isDst, name);        
        writeZonePropsByTime(w, isDst, name,
                offset, offset, DEF_TZSTARTTIME - offset, FALSE, status);    
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
    } else {
        if (dstCount > 0) {
            if (finalDstRule == NULL) {
                if (dstCount == 1) {
                    writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                            dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (dstCount == 1) {
                    writeFinalRule(w, TRUE, finalDstRule,
                            dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, dstStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(dstMonth, dstWeekInMonth, dstDayOfWeek, finalDstRule->getRule())) {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalDstRule->getNextStart(dstUntilTime, dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, TRUE, finalDstRule,
                                    dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }
        if (stdCount > 0) {
            if (finalStdRule == NULL) {
                if (stdCount == 1) {
                    writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                            stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (stdCount == 1) {
                    writeFinalRule(w, FALSE, finalStdRule,
                            stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, stdStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(stdMonth, stdWeekInMonth, stdDayOfWeek, finalStdRule->getRule())) {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalStdRule->getNextStart(stdUntilTime, stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, FALSE, finalStdRule,
                                    stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }            
    }
    writeFooter(w, status);

cleanupWriteZone:

    if (finalStdRule != NULL) {
        delete finalStdRule;
    }
    if (finalDstRule != NULL) {
        delete finalDstRule;
    }
}